

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O3

void __thiscall ConditionalEstimator::~ConditionalEstimator(ConditionalEstimator *this)

{
  double *pdVar1;
  bool *pbVar2;
  int iVar3;
  int iVar4;
  double **ppdVar5;
  long lVar6;
  
  (this->super_Estimator).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__ConditionalEstimator_0015b928;
  if (this->condSamples != (double *)0x0) {
    operator_delete__(this->condSamples);
  }
  if (this->aOne != (double *)0x0) {
    operator_delete__(this->aOne);
  }
  if (this->aTwo != (double *)0x0) {
    operator_delete__(this->aTwo);
  }
  if ((this->aThree != (double *)0x0) && (this->aTwo != (double *)0x0)) {
    operator_delete__(this->aTwo);
  }
  if (this->aEvents != (double *)0x0) {
    operator_delete__(this->aEvents);
  }
  ppdVar5 = this->aDist;
  if (ppdVar5 != (double **)0x0) {
    iVar3 = this->nPre;
    iVar4 = this->nPost;
    if (-1 < iVar4 + iVar3) {
      lVar6 = -1;
      do {
        if (this->aDist[lVar6 + 1] != (double *)0x0) {
          operator_delete__(this->aDist[lVar6 + 1]);
          iVar3 = this->nPre;
          iVar4 = this->nPost;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar4 + iVar3);
      ppdVar5 = this->aDist;
    }
    operator_delete(ppdVar5,8);
  }
  pdVar1 = (this->condConditionRing).ringData;
  if (pdVar1 != (double *)0x0) {
    operator_delete__(pdVar1);
  }
  (this->condConditionRing).ringData = (double *)0x0;
  pbVar2 = (this->condEventRing).ringData;
  if (pbVar2 != (bool *)0x0) {
    operator_delete__(pbVar2);
  }
  (this->condEventRing).ringData = (bool *)0x0;
  pdVar1 = (this->condSampleRing).ringData;
  if (pdVar1 != (double *)0x0) {
    operator_delete__(pdVar1);
  }
  (this->condSampleRing).ringData = (double *)0x0;
  Estimator::~Estimator(&this->super_Estimator);
  return;
}

Assistant:

ConditionalEstimator::~ConditionalEstimator()
{
	if(condSamples) delete[] condSamples;
	if(aOne) delete[] aOne;
	if(aTwo) delete[] aTwo;
	if(aThree) delete[] aTwo;
	if(aEvents) delete[] aEvents;
	if(aDist) {
		for(int i=0; i<nPre+nPost+1; i++)
			delete[] aDist[i];
		delete aDist;
	}
}